

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O1

int testSimpleNNShape(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<float> *this;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  ConvolutionLayerParams *pCVar5;
  long lVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  void *pvVar14;
  InnerProductLayerParams *pIVar15;
  WeightParams *pWVar16;
  float *pfVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  uint uVar20;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar21;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar22;
  Arena *pAVar23;
  Model m1;
  Result res;
  NeuralNetworkShaper shapes;
  Model local_e0;
  Result local_b0;
  NeuralNetworkShaper local_88;
  
  CoreML::Specification::Model::Model(&local_e0,(Arena *)0x0,false);
  if (local_e0.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(local_e0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_e0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_e0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar3 = ((local_e0.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00174f4e:
    pRVar21 = &(local_e0.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar22 = ((local_e0.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar22) goto LAB_00174f4e;
    ((local_e0.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar3->elements[iVar22];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"input",puVar19);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar4 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar20 = (pAVar9->shape_).current_size_;
  uVar2 = (pAVar9->shape_).total_size_;
  if (uVar20 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar20] = 4;
  pRVar1->current_size_ = uVar20 + 1;
  if (local_e0.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(local_e0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_e0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_e0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar3 = ((local_e0.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00175060:
    pRVar21 = &(local_e0.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar22 = ((local_e0.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar22) goto LAB_00175060;
    ((local_e0.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar3->elements[iVar22];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"output",puVar19);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar4 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar20 = (pAVar9->shape_).current_size_;
  uVar2 = (pAVar9->shape_).total_size_;
  if (uVar20 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar20] = 3;
  pRVar1->current_size_ = uVar20 + 1;
  if (local_e0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_e0);
    local_e0._oneof_case_[0] = 500;
    pAVar23 = (Arena *)(local_e0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_e0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_e0.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar23);
  }
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_e0.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00175186:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_e0.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar12);
  }
  else {
    iVar22 = (local_e0.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar22) goto LAB_00175186;
    (local_e0.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar22 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar3->elements[iVar22];
  }
  pRVar3 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001751be:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar22 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar22) goto LAB_001751be;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar3->elements[iVar22];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3cb973);
  pRVar3 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar22 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar22 < pRVar3->allocated_size) {
      (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
      pvVar14 = pRVar3->elements[iVar22];
      goto LAB_00175228;
    }
  }
  pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
LAB_00175228:
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3dece7);
  if (pNVar12->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x8c;
    uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pIVar15 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(pAVar23);
    (pNVar12->layer_).innerproduct_ = pIVar15;
  }
  pCVar5 = (pNVar12->layer_).convolution_;
  *(undefined8 *)&pCVar5->_kernelsize_cached_byte_size_ = 4;
  (pCVar5->stride_).current_size_ = 3;
  (pCVar5->stride_).total_size_ = 0;
  iVar22 = 0xc;
  do {
    lVar6._0_4_ = (pCVar5->kernelsize_).current_size_;
    lVar6._4_4_ = (pCVar5->kernelsize_).total_size_;
    if (lVar6 == 0) {
      uVar4 = (pCVar5->super_MessageLite)._internal_metadata_.ptr_;
      pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar23 = *(Arena **)pAVar23;
      }
      pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar23);
      *(WeightParams **)&pCVar5->kernelsize_ = pWVar16;
    }
    lVar6 = *(long *)&pCVar5->kernelsize_;
    this = (RepeatedField<float> *)(lVar6 + 0x10);
    uVar20 = *(uint *)(lVar6 + 0x10);
    if (uVar20 == *(uint *)(lVar6 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(this,*(uint *)(lVar6 + 0x14) + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(this);
    pfVar17[uVar20] = 1.0;
    this->current_size_ = uVar20 + 1;
    iVar22 = iVar22 + -1;
  } while (iVar22 != 0);
  *(undefined1 *)&(pCVar5->stride_).arena_or_elements_ = 0;
  CoreML::validate<(MLModelType)500>(&local_b0,&local_e0);
  bVar7 = CoreML::Result::good(&local_b0);
  if (bVar7) {
    CoreML::NeuralNetworkShaper::NeuralNetworkShaper(&local_88,&local_e0,true);
    bVar7 = CoreML::NeuralNetworkShaper::isValid(&local_88);
    if (!bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                 ,100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x33);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"shapes.isValid()",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
    }
    uVar20 = (uint)!bVar7;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
    ::~_Rb_tree(&local_88.blobShapes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_88.blobColors._M_t);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    uVar20 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_message._M_dataplus._M_p != &local_b0.m_message.field_2) {
    operator_delete(local_b0.m_message._M_dataplus._M_p,
                    local_b0.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_e0);
  return uVar20;
}

Assistant:

int testSimpleNNShape() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(4);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(4);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 12; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    NeuralNetworkShaper shapes = NeuralNetworkShaper(m1);

    ML_ASSERT(shapes.isValid());

    return 0;

}